

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_movcond_i64_m68k
               (TCGContext_conflict2 *tcg_ctx,TCGCond cond,TCGv_i64 ret,TCGv_i64 c1,TCGv_i64 c2,
               TCGv_i64 v1,TCGv_i64 v2)

{
  TCGOp *pTVar1;
  uintptr_t o;
  uintptr_t o_5;
  uintptr_t o_3;
  uintptr_t o_1;
  uintptr_t o_6;
  
  if (cond == TCG_COND_NEVER) {
    if (ret != v2) {
      pTVar1 = tcg_emit_op_m68k(tcg_ctx,INDEX_op_mov_i64);
      pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
      pTVar1->args[1] = (TCGArg)(v2 + (long)tcg_ctx);
    }
  }
  else if (cond == TCG_COND_ALWAYS) {
    if (ret != v1) {
      pTVar1 = tcg_emit_op_m68k(tcg_ctx,INDEX_op_mov_i64);
      pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
      pTVar1->args[1] = (TCGArg)(v1 + (long)tcg_ctx);
    }
  }
  else {
    pTVar1 = tcg_emit_op_m68k(tcg_ctx,INDEX_op_movcond_i64);
    pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar1->args[1] = (TCGArg)(c1 + (long)tcg_ctx);
    pTVar1->args[2] = (TCGArg)(c2 + (long)tcg_ctx);
    pTVar1->args[3] = (TCGArg)(v1 + (long)tcg_ctx);
    pTVar1->args[4] = (TCGArg)(v2 + (long)tcg_ctx);
    pTVar1->args[5] = (ulong)cond;
  }
  return;
}

Assistant:

void tcg_gen_movcond_i64(TCGContext *tcg_ctx, TCGCond cond, TCGv_i64 ret, TCGv_i64 c1,
                         TCGv_i64 c2, TCGv_i64 v1, TCGv_i64 v2)
{
    if (cond == TCG_COND_ALWAYS) {
        tcg_gen_mov_i64(tcg_ctx, ret, v1);
    } else if (cond == TCG_COND_NEVER) {
        tcg_gen_mov_i64(tcg_ctx, ret, v2);
    } else {
#if TCG_TARGET_REG_BITS == 32
        TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_op6i_i32(tcg_ctx, INDEX_op_setcond2_i32, t0,
                         TCGV_LOW(tcg_ctx, c1), TCGV_HIGH(tcg_ctx, c1),
                         TCGV_LOW(tcg_ctx, c2), TCGV_HIGH(tcg_ctx, c2), cond);

#if TCG_TARGET_HAS_movcond_i32
            tcg_gen_movi_i32(tcg_ctx, t1, 0);
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, TCGV_LOW(tcg_ctx, ret), t0, t1,
                                TCGV_LOW(tcg_ctx, v1), TCGV_LOW(tcg_ctx, v2));
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, TCGV_HIGH(tcg_ctx, ret), t0, t1,
                                TCGV_HIGH(tcg_ctx, v1), TCGV_HIGH(tcg_ctx, v2));
#else
            tcg_gen_neg_i32(tcg_ctx, t0, t0);

            tcg_gen_and_i32(tcg_ctx, t1, TCGV_LOW(tcg_ctx, v1), t0);
            tcg_gen_andc_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, v2), t0);
            tcg_gen_or_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, ret), t1);

            tcg_gen_and_i32(tcg_ctx, t1, TCGV_HIGH(tcg_ctx, v1), t0);
            tcg_gen_andc_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, v2), t0);
            tcg_gen_or_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, ret), t1);
#endif
        tcg_temp_free_i32(tcg_ctx, t0);
        tcg_temp_free_i32(tcg_ctx, t1);
#elif TCG_TARGET_HAS_movcond_i64
        tcg_gen_op6i_i64(tcg_ctx, INDEX_op_movcond_i64, ret, c1, c2, v1, v2, cond);
#else
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_setcond_i64(tcg_ctx, cond, t0, c1, c2);
        tcg_gen_neg_i64(tcg_ctx, t0, t0);
        tcg_gen_and_i64(tcg_ctx, t1, v1, t0);
        tcg_gen_andc_i64(tcg_ctx, ret, v2, t0);
        tcg_gen_or_i64(tcg_ctx, ret, ret, t1);
        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
#endif
    }
}